

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

GLFWbool waitForEvent(double *timeout)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timeval tv;
  fd_set fds;
  GLFWbool local_dc;
  timeval local_d8;
  double local_c8;
  double dStack_c0;
  fd_set local_b8;
  
  iVar2 = *(int *)(_glfw.x11.display + 0x10);
  local_b8.fds_bits[0] = 0;
  local_b8.fds_bits[1] = 0;
  local_b8.fds_bits[2] = 0;
  local_b8.fds_bits[3] = 0;
  local_b8.fds_bits[4] = 0;
  local_b8.fds_bits[5] = 0;
  local_b8.fds_bits[6] = 0;
  local_b8.fds_bits[7] = 0;
  local_b8.fds_bits[8] = 0;
  local_b8.fds_bits[9] = 0;
  local_b8.fds_bits[10] = 0;
  local_b8.fds_bits[0xb] = 0;
  local_b8.fds_bits[0xc] = 0;
  local_b8.fds_bits[0xd] = 0;
  local_b8.fds_bits[0xe] = 0;
  local_b8.fds_bits[0xf] = 0;
  iVar8 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar8 = iVar2;
  }
  local_b8.fds_bits[iVar8 >> 6] = local_b8.fds_bits[iVar8 >> 6] | 1L << ((byte)iVar2 & 0x3f);
  iVar8 = _glfw.linux_js.inotify + 0x3f;
  if (-1 < _glfw.linux_js.inotify) {
    iVar8 = _glfw.linux_js.inotify;
  }
  local_b8.fds_bits[iVar8 >> 6] =
       local_b8.fds_bits[iVar8 >> 6] | 1L << ((byte)_glfw.linux_js.inotify & 0x3f);
  iVar8 = _glfw.linux_js.inotify;
  if (_glfw.linux_js.inotify < iVar2) {
    iVar8 = iVar2;
  }
  do {
    while (timeout != (double *)0x0) {
      local_d8.tv_sec = (__time_t)*timeout;
      local_d8.tv_usec = (__suseconds_t)((*timeout - (double)local_d8.tv_sec) * 1000000.0);
      uVar5 = _glfwPlatformGetTimerValue();
      iVar3 = select(iVar8 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_d8);
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      uVar6 = _glfwPlatformGetTimerValue();
      lVar7 = uVar6 - uVar5;
      auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = 0x45300000;
      dStack_c0 = auVar10._8_8_ - 1.9342813113834067e+25;
      local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      uVar5 = _glfwPlatformGetTimerFrequency();
      auVar11._8_4_ = (int)(uVar5 >> 0x20);
      auVar11._0_8_ = uVar5;
      auVar11._12_4_ = 0x45300000;
      dVar9 = *timeout -
              local_c8 /
              ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
      *timeout = dVar9;
      if (iVar3 < 1) {
        bVar1 = 0.0 < dVar9 && (iVar2 != 4 || iVar3 != -1);
        if (0.0 >= dVar9 || iVar2 == 4 && iVar3 == -1) {
          local_dc = 0;
        }
      }
      else {
        local_dc = 1;
        bVar1 = false;
      }
      if (!bVar1) {
        return local_dc;
      }
    }
    iVar2 = select(iVar8 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar2 != -1) {
      return 1;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  return 1;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

    FD_ZERO(&fds);
    FD_SET(fd, &fds);
#if defined(__linux__)
    FD_SET(_glfw.linux_js.inotify, &fds);

    if (fd < _glfw.linux_js.inotify)
        count = _glfw.linux_js.inotify + 1;
#endif
    for (;;)
    {
        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}